

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

void __thiscall
testing::internal::ForkingDeathTest::ForkingDeathTest
          (ForkingDeathTest *this,char *a_statement,RE *a_regex)

{
  DeathTestImpl::DeathTestImpl(&this->super_DeathTestImpl,a_statement,a_regex);
  (this->super_DeathTestImpl).super_DeathTest._vptr_DeathTest =
       (_func_int **)&PTR__DeathTestImpl_00189ef8;
  *(undefined4 *)&(this->super_DeathTestImpl).field_0x2c = 0xffffffff;
  return;
}

Assistant:

ForkingDeathTest::ForkingDeathTest(const char* a_statement, const RE* a_regex)
    : DeathTestImpl(a_statement, a_regex),
      child_pid_(-1) {}